

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.h
# Opt level: O0

bool __thiscall JsArrayKills::KillsValueType(JsArrayKills *this,ValueType valueType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  JsArrayKills *this_local;
  ValueType valueType_local;
  
  this_local._6_2_ = valueType.field_0;
  bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)((long)&this_local + 6));
  if ((!bVar2) &&
     (bVar2 = ValueType::IsOptimizedVirtualTypedArray((ValueType *)((long)&this_local + 6)), !bVar2)
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.h"
                       ,0x16a,
                       "(valueType.IsArrayOrObjectWithArray() || valueType.IsOptimizedVirtualTypedArray())"
                       ,
                       "valueType.IsArrayOrObjectWithArray() || valueType.IsOptimizedVirtualTypedArray()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_21 = 1;
  if (((this->field_0).bits & 1) != 0) goto LAB_005bbdbd;
  bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)((long)&this_local + 6));
  local_22 = 0;
  if (bVar2) {
    if (((this->field_0).bits >> 1 & 1) == 0) {
LAB_005bbd56:
      if ((((this->field_0).bits >> 2 & 1) != 0) &&
         (bVar2 = ValueType::IsArray((ValueType *)((long)&this_local + 6)), !bVar2)) {
        bVar2 = ValueType::HasNoMissingValues((ValueType *)((long)&this_local + 6));
        local_23 = 1;
        if (bVar2) goto LAB_005bbdb1;
      }
      local_24 = 0;
      if (((this->field_0).bits >> 3 & 1) != 0) {
        bVar2 = ValueType::HasVarElements((ValueType *)((long)&this_local + 6));
        local_24 = bVar2 ^ 0xff;
      }
      local_23 = local_24;
    }
    else {
      bVar2 = ValueType::HasNoMissingValues((ValueType *)((long)&this_local + 6));
      local_23 = 1;
      if (!bVar2) goto LAB_005bbd56;
    }
LAB_005bbdb1:
    local_22 = local_23;
  }
  local_21 = local_22;
LAB_005bbdbd:
  return (bool)(local_21 & 1);
}

Assistant:

bool KillsValueType(const ValueType valueType) const
    {
        Assert(valueType.IsArrayOrObjectWithArray() || valueType.IsOptimizedVirtualTypedArray());

        return
            killsAllArrays ||
            (valueType.IsArrayOrObjectWithArray() &&
             (
              (killsArraysWithNoMissingValues && valueType.HasNoMissingValues()) ||
              (killsObjectArraysWithNoMissingValues && !valueType.IsArray() && valueType.HasNoMissingValues()) ||
              (killsNativeArrays && !valueType.HasVarElements())
             )
            );
    }